

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

GRULayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::GRULayerParams>(Arena *arena)

{
  GRULayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (GRULayerParams *)operator_new(0x88);
    CoreML::Specification::GRULayerParams::GRULayerParams(this,(Arena *)0x0,false);
  }
  else {
    this = (GRULayerParams *)
           AllocateAlignedWithHook
                     (arena,0x88,(type_info *)&CoreML::Specification::GRULayerParams::typeinfo);
    CoreML::Specification::GRULayerParams::GRULayerParams(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }